

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov5_pnnx.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar9;
  char *pcVar10;
  undefined8 *puVar11;
  int *piVar12;
  char cVar13;
  int iVar14;
  int iVar15;
  pointer pOVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  pointer pOVar20;
  ulong uVar21;
  vector<Object,_std::allocator<Object>_> *objects_00;
  long lVar22;
  uint left;
  float fVar23;
  float fVar24;
  int top;
  float fVar27;
  __m128 t_2;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  __m128 t;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vector<Object,_std::allocator<Object>_> objects8;
  allocator local_379;
  vector<Object,_std::allocator<Object>_> proposals;
  int baseLine;
  Extractor ex;
  undefined1 local_348 [64];
  size_t local_308;
  vector<float,_std::allocator<float>_> areas;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  undefined1 local_258 [64];
  size_t local_218;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  Mat image;
  undefined4 local_1f0;
  int iStack_1ec;
  Allocator *local_1d8;
  Mat m;
  undefined8 local_190;
  uchar *local_188;
  Net yolov5;
  
  if (argc == 2) {
    pcVar10 = argv[1];
    std::__cxx11::string::string((string *)&yolov5,pcVar10,(allocator *)&image);
    cv::imread((string *)&m,(int)&yolov5);
    std::__cxx11::string::~string((string *)&yolov5);
    cVar13 = cv::Mat::empty();
    if (cVar13 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov5);
      yolov5.opt.use_vulkan_compute = true;
      iVar14 = ncnn::Net::load_param(&yolov5,"yolov5s.ncnn.param");
      if ((iVar14 != 0) || (iVar14 = ncnn::Net::load_model(&yolov5,"yolov5s.ncnn.bin"), iVar14 != 0)
         ) {
        exit(-1);
      }
      local_208 = (float)local_190;
      fStack_204 = (float)((ulong)local_190 >> 0x20);
      fStack_200 = 0.0;
      fStack_1fc = 0.0;
      if ((int)local_208 < (int)fStack_204) {
        local_2a8._4_4_ = 640.0 / (float)(int)fStack_204;
        iVar15 = (int)((float)(int)local_208 * (float)local_2a8._4_4_);
        iVar14 = 0x280;
      }
      else {
        local_2a8._4_4_ = 640.0 / (float)(int)local_208;
        iVar14 = (int)((float)(int)fStack_204 * (float)local_2a8._4_4_);
        iVar15 = 0x280;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,0x10002,(int)fStack_204,(int)local_208,iVar14,iVar15,
                 (Allocator *)0x0);
      local_218 = 0;
      local_258._0_4_ = 0;
      local_258._4_4_ = 0;
      local_258._8_4_ = 0;
      local_258._12_4_ = 0;
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._24_4_ = 0;
      local_258._32_8_ = (Allocator *)0x0;
      local_258._40_4_ = 0;
      local_258._44_4_ = 0;
      local_258._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&areas);
      iVar14 = ((iVar14 + 0x3f) / 0x40) * 0x40 - iVar14;
      iVar15 = ((iVar15 + 0x3f) / 0x40) * 0x40 - iVar15;
      left = iVar14 / 2;
      top = iVar15 / 2;
      objects_00 = (vector<Object,_std::allocator<Object>_> *)(ulong)left;
      ncnn::copy_make_border
                ((Mat *)&image,(Mat *)local_258,top,iVar15 - top,left,iVar14 - left,0,114.0,
                 (Option *)&areas);
      norm_vals[0] = 0.003921569;
      norm_vals[1] = 0.003921569;
      norm_vals[2] = 0.003921569;
      ncnn::Mat::substract_mean_normalize((Mat *)local_258,(float *)0x0,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"in0",(Mat *)local_258);
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out0",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar11 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar11 = 0x4150000041200000;
      puVar11[1] = 0x41f0000041800000;
      puVar11[2] = 0x41b8000042040000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,8,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar12 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out1",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar11 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar11 = 0x4274000041f00000;
      puVar11[1] = 0x4234000042780000;
      puVar11[2] = 0x42ee0000426c0000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x10,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar12 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Extractor::extract(&ex,"out2",(Mat *)&areas,0);
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      local_348._24_4_ = 0;
      local_348._32_8_ = (Allocator *)0x0;
      local_348._40_4_ = 0;
      local_348._44_4_ = 0;
      local_348._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,6,4,(Allocator *)0x0);
      puVar11 = (undefined8 *)CONCAT44(local_348._4_4_,local_348._0_4_);
      *puVar11 = 0x42b4000042e80000;
      puVar11[1] = 0x43460000431c0000;
      puVar11[2] = 0x43a3000043ba8000;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)local_348,0x20,(Mat *)&areas,(Mat *)&objects8,0.0,objects_00);
      std::vector<Object,std::allocator<Object>>::
      insert<__gnu_cxx::__normal_iterator<Object*,std::vector<Object,std::allocator<Object>>>,void>
                ((vector<Object,std::allocator<Object>> *)&proposals,
                 (const_iterator)
                 proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Object_*,_std::vector<Object,_std::allocator<Object>_>_>)
                 objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects8.super__Vector_base<Object,_std::allocator<Object>_>);
      piVar12 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*(*(_func_int ***)local_348._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pOVar16 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&proposals,0,
                   (int)(((long)proposals.super__Vector_base<Object,_std::allocator<Object>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                               .super__Vector_impl_data._M_start) / 0x18) + -1);
        pOVar16 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_8_ = (pointer)0x0;
      uVar17 = ((long)pOVar16 -
               (long)proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                     super__Vector_impl_data._M_start) / 0x18;
      iVar14 = (int)uVar17;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)iVar14,(allocator_type *)&objects8);
      uVar19 = 0;
      uVar21 = 0;
      if (0 < iVar14) {
        uVar21 = uVar17 & 0xffffffff;
      }
      pfVar18 = &((proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start)->rect).height;
      for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar19] = pfVar18[-1] * *pfVar18;
        pfVar18 = pfVar18 + 6;
      }
      iVar15 = 0;
      while( true ) {
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = (float)iVar15;
        if (iVar14 <= iVar15) break;
        pOVar16 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar15;
        uVar19 = (ulong)(CONCAT44(local_348._12_4_,local_348._8_4_) -
                        CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2;
        uVar17 = uVar19 & 0xffffffff;
        if ((int)uVar19 < 1) {
          uVar17 = 0;
        }
        uVar19 = 1;
        for (uVar21 = 0; uVar17 != uVar21; uVar21 = uVar21 + 1) {
          iVar9 = *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar21 * 4);
          if (pOVar16->label ==
              proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
              super__Vector_impl_data._M_start[iVar9].label) {
            pOVar20 = proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar9;
            uVar3._0_4_ = (pOVar16->rect).x;
            uVar3._4_4_ = (pOVar16->rect).y;
            auVar28._8_8_ = 0;
            auVar28._0_8_ = uVar3;
            uVar1 = (pOVar16->rect).width;
            uVar7 = (pOVar16->rect).height;
            uVar4._0_4_ = (pOVar20->rect).x;
            uVar4._4_4_ = (pOVar20->rect).y;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = uVar4;
            uVar2 = (pOVar20->rect).width;
            uVar8 = (pOVar20->rect).height;
            auVar25._0_4_ = (float)uVar2 + (float)(undefined4)uVar4;
            auVar25._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
            auVar25._8_8_ = 0;
            auVar32 = maxps(auVar31,auVar28);
            auVar30._0_4_ = (float)uVar1 + (float)(undefined4)uVar3;
            auVar30._4_4_ = (float)uVar7 + (float)uVar3._4_4_;
            auVar30._8_8_ = 0;
            auVar26 = minps(auVar25,auVar30);
            fVar23 = auVar26._0_4_ - auVar32._0_4_;
            fVar27 = auVar26._4_4_ - auVar32._4_4_;
            fVar24 = 0.0;
            if (0.0 < fVar27 && 0.0 < fVar23) {
              fVar24 = fVar23 * fVar27;
            }
            if (0.45 < fVar24 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start[iVar15] +
                                 areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                 super__Vector_impl_data._M_start[iVar9]) - fVar24)) {
              uVar19 = 0;
            }
          }
        }
        if ((int)uVar19 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_348,
                     (value_type_conflict1 *)&objects8);
          iVar15 = (int)objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_;
        }
        iVar15 = iVar15 + 1;
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&areas.super__Vector_base<float,_std::allocator<float>_>);
      uVar17 = (ulong)(CONCAT44(local_348._12_4_,local_348._8_4_) -
                      CONCAT44(local_348._4_4_,local_348._0_4_)) >> 2;
      iVar14 = (int)uVar17;
      std::vector<Object,_std::allocator<Object>_>::resize(&objects,(long)iVar14);
      iVar15 = (int)fStack_204 + -1;
      fStack_204 = (float)((int)local_208 + -1);
      local_208 = (float)iVar15;
      fStack_200 = (float)((int)fStack_200 + -1);
      fStack_1fc = (float)((int)fStack_1fc + -1);
      uVar19 = 0;
      uVar17 = uVar17 & 0xffffffff;
      if (iVar14 < 1) {
        uVar17 = uVar19;
      }
      local_2a8._0_4_ = local_2a8._4_4_;
      fStack_2a0 = (float)local_2a8._4_4_;
      fStack_29c = (float)local_2a8._4_4_;
      lVar22 = 8;
      for (; uVar17 != uVar19; uVar19 = uVar19 + 1) {
        Object::operator=((Object *)
                          ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl
                                 .super__Vector_impl_data._M_start + lVar22 + -8),
                          proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          *(int *)(CONCAT44(local_348._4_4_,local_348._0_4_) + uVar19 * 4));
        uVar5 = *(undefined8 *)
                 ((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar22 + -8);
        uVar6 = *(undefined8 *)
                 ((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_start)->rect).x + lVar22);
        fVar23 = (float)uVar5;
        fVar24 = (float)((ulong)uVar5 >> 0x20);
        auVar32._0_4_ = fVar23 - (float)(int)left;
        auVar32._4_4_ = fVar24 - (float)top;
        auVar32._8_8_ = 0;
        auVar32 = divps(auVar32,_local_2a8);
        auVar29._0_4_ = ((float)uVar6 + fVar23) - (float)(int)left;
        auVar29._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar24) - (float)top;
        auVar29._8_8_ = 0;
        auVar29 = divps(auVar29,_local_2a8);
        auVar26._4_4_ = fStack_204;
        auVar26._0_4_ = local_208;
        auVar26._8_4_ = fStack_200;
        auVar26._12_4_ = fStack_1fc;
        auVar32 = minps(auVar26,auVar32);
        auVar32 = maxps(ZEXT816(0),auVar32);
        auVar26 = minps(auVar26,auVar29);
        auVar26 = maxps(ZEXT816(0),auVar26);
        *(long *)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar22 + -8) = auVar32._0_8_;
        *(ulong *)((long)&((objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                            super__Vector_impl_data._M_start)->rect).x + lVar22) =
             CONCAT44(auVar26._4_4_ - auVar32._4_4_,auVar26._0_4_ - auVar32._0_4_);
        lVar22 = lVar22 + 0x18;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_348);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&proposals.super__Vector_base<Object,_std::allocator<Object>_>);
      ncnn::Extractor::~Extractor(&ex);
      piVar12 = (int *)CONCAT44(local_258._12_4_,local_258._8_4_);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if ((Allocator *)local_258._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_258._4_4_,local_258._0_4_));
          }
          else {
            (*(*(_func_int ***)local_258._32_8_)[3])();
          }
        }
      }
      piVar12 = (int *)CONCAT44(iStack_1ec,local_1f0);
      if (piVar12 != (int *)0x0) {
        LOCK();
        *piVar12 = *piVar12 + -1;
        UNLOCK();
        if (*piVar12 == 0) {
          if (local_1d8 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_1d8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&yolov5);
      cv::Mat::clone();
      lVar22 = 0;
      uVar17 = 0;
      while( true ) {
        pOVar16 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_258._8_8_ = &image;
        if ((ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18) <= uVar17) break;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->prob + lVar22)
                ,(double)*(float *)((long)&((objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                   lVar22),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar22),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar22),
                SUB84((double)*(float *)((long)&((objects.
                                                  super__Vector_base<Object,_std::allocator<Object>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                height + lVar22),0),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar22)
               );
        local_258._16_4_ = 0;
        local_258._20_4_ = 0;
        local_258._0_4_ = 0x3010000;
        pfVar18 = (float *)((long)&(pOVar16->rect).x + lVar22);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = (int)ROUND(pfVar18[1]);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = (int)ROUND(*pfVar18);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = (int)ROUND(pfVar18[2]);
        proposals.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = (int)ROUND(pfVar18[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolov5);
        yolov5._vptr_Net = (_func_int **)0x406fe00000000000;
        yolov5.opt.lightmode = false;
        yolov5.opt._1_3_ = 0;
        yolov5.opt.num_threads = 0;
        yolov5.opt.blob_allocator = (Allocator *)0x0;
        yolov5.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle((string *)local_258,&proposals,&yolov5,1,8,0);
        sprintf((char *)&yolov5,"%s %.1f%%",
                (double)(*(float *)((long)&pOVar16->prob + lVar22) * 100.0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar16->label + lVar22) * 4));
        std::__cxx11::string::string((string *)local_258,(char *)&yolov5,(allocator *)local_348);
        cv::getTextSize((string *)&ex,(int)(string *)local_258,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)local_258);
        fVar23 = (float)(int)*(float *)((long)&(pOVar16->rect).x + lVar22);
        iVar14 = (int)((*(float *)((long)&(pOVar16->rect).y + lVar22) -
                       (float)ex._vptr_Extractor._4_4_) - 0.0);
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        fVar24 = (float)(iStack_1ec - (int)ex._vptr_Extractor);
        if ((int)ex._vptr_Extractor + (int)fVar23 <= iStack_1ec) {
          fVar24 = fVar23;
        }
        local_348._16_8_ = (pointer)0x0;
        local_348._0_4_ = 0x3010000;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._4_4_ = iVar14;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_start._0_4_ = fVar24;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._0_4_ = (int)ex._vptr_Extractor;
        objects8.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data
        ._M_finish._4_4_ = ex._vptr_Extractor._4_4_;
        local_348._8_8_ = &image;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_258);
        local_258._0_4_ = 0;
        local_258._4_4_ = 0x406fe000;
        local_258._8_4_ = 0;
        local_258._12_4_ = 0x406fe000;
        local_258._16_4_ = 0;
        local_258._20_4_ = 0x406fe000;
        local_258._24_4_ = 0;
        local_258._28_4_ = 0;
        cv::rectangle(local_348,&objects8,(string *)local_258,0xffffffffffffffff,8,0);
        local_348._16_8_ = (pointer)0x0;
        local_348._0_4_ = 0x3010000;
        local_348._8_8_ = &image;
        std::__cxx11::string::string((string *)local_258,(char *)&yolov5,&local_379);
        norm_vals[1] = (float)(iVar14 + ex._vptr_Extractor._4_4_);
        norm_vals[0] = fVar24;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&areas);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        cv::putText(0x3fe0000000000000,local_348,(string *)local_258,norm_vals,0,
                    (Matx<double,_4,_1> *)&areas,1,8,0);
        std::__cxx11::string::~string((string *)local_258);
        uVar17 = uVar17 + 1;
        lVar22 = lVar22 + 0x18;
      }
      std::__cxx11::string::string((string *)&yolov5,"image",(allocator *)local_348);
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      local_258._0_4_ = 0x1010000;
      cv::imshow((string *)&yolov5,(_InputArray *)local_258);
      std::__cxx11::string::~string((string *)&yolov5);
      iVar14 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar10);
      iVar14 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar14 = -1;
  }
  return iVar14;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov5(m, objects);

    draw_objects(m, objects);

    return 0;
}